

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O3

void patch_CheckAssertions(Assertion *assert)

{
  PatchType PVar1;
  Assertion *pAVar2;
  int32_t iVar3;
  char *pcVar4;
  
  if (beVerbose) {
    patch_CheckAssertions();
  }
  initRPNStack();
  if (assert != (Assertion *)0x0) {
    do {
      iVar3 = computeRPNExpr(&assert->patch,assert->fileSymbols);
      PVar1 = (assert->patch).type;
      if (iVar3 == 0 && isError == false) {
        if (PVar1 == PATCHTYPE_BYTE) {
          pcVar4 = assert->message;
          if (*pcVar4 == '\0') {
            pcVar4 = "assert failure";
          }
          warning((assert->patch).src,(assert->patch).lineNo,"%s",pcVar4);
        }
        else if (PVar1 == PATCHTYPE_WORD) {
          pcVar4 = assert->message;
          if (*pcVar4 == '\0') {
            pcVar4 = "assert failure";
          }
          error((assert->patch).src,(assert->patch).lineNo,"%s",pcVar4);
        }
        else if (PVar1 == PATCHTYPE_LONG) {
          pcVar4 = "assert failure";
          if (*assert->message != '\0') {
            pcVar4 = assert->message;
          }
          fatal((assert->patch).src,(assert->patch).lineNo,"%s",pcVar4);
        }
      }
      else if ((isError != false) && (PVar1 == PATCHTYPE_LONG)) {
        pcVar4 = ": ";
        if (*assert->message == '\0') {
          pcVar4 = "";
        }
        fatal((assert->patch).src,(assert->patch).lineNo,"couldn\'t evaluate assertion%s%s",pcVar4);
      }
      pAVar2 = assert->next;
      free((assert->patch).rpnExpression);
      free(assert->message);
      free(assert);
      assert = pAVar2;
    } while (pAVar2 != (Assertion *)0x0);
  }
  free(stack.values);
  free(stack.errorFlags);
  return;
}

Assistant:

void patch_CheckAssertions(struct Assertion *assert)
{
	verbosePrint("Checking assertions...\n");
	initRPNStack();

	while (assert) {
		int32_t value = computeRPNExpr(&assert->patch,
			(struct Symbol const * const *)assert->fileSymbols);
		enum AssertionType type = (enum AssertionType)assert->patch.type;

		if (!isError && !value) {
			switch (type) {
			case ASSERT_FATAL:
				fatal(assert->patch.src, assert->patch.lineNo, "%s",
				      assert->message[0] ? assert->message
							 : "assert failure");
			case ASSERT_ERROR:
				error(assert->patch.src, assert->patch.lineNo, "%s",
				      assert->message[0] ? assert->message
							 : "assert failure");
				break;
			case ASSERT_WARN:
				warning(assert->patch.src, assert->patch.lineNo, "%s",
					assert->message[0] ? assert->message
							   : "assert failure");
				break;
			}
		} else if (isError && type == ASSERT_FATAL) {
			fatal(assert->patch.src, assert->patch.lineNo,
			      "couldn't evaluate assertion%s%s",
			      assert->message[0] ? ": " : "",
			      assert->message);
		}
		struct Assertion *next = assert->next;

		free(assert->patch.rpnExpression);
		free(assert->message);
		free(assert);
		assert = next;
	}

	freeRPNStack();
}